

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O2

void __thiscall
FValueTextItem::FValueTextItem
          (FValueTextItem *this,int x,int y,int height,char *text,FFont *font,EColorRange color,
          EColorRange valuecolor,FName action,FName values)

{
  FOptionValues **ppFVar1;
  uint i;
  ulong uVar2;
  long lVar3;
  undefined4 in_stack_0000001c;
  undefined4 in_stack_00000024;
  FName local_30;
  FName local_2c;
  
  local_2c.Index = *(int *)CONCAT44(in_stack_0000001c,action.Index);
  FListMenuItemSelectable::FListMenuItemSelectable
            (&this->super_FListMenuItemSelectable,x,y,height,&local_2c,-1);
  (this->super_FListMenuItemSelectable).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FValueTextItem_007c0b10;
  (this->mSelections).Array = (FString *)0x0;
  (this->mSelections).Most = 0;
  (this->mSelections).Count = 0;
  (this->mText).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FString::operator=(&this->mText,text);
  this->mFont = font;
  this->mFontColor = color;
  this->mFontColor2 = valuecolor;
  this->mSelection = 0;
  local_30.Index = *(int *)CONCAT44(in_stack_00000024,values.Index);
  if (local_30.Index != 0) {
    ppFVar1 = TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>::
              CheckKey(&OptionValues,&local_30);
    if (ppFVar1 != (FOptionValues **)0x0) {
      lVar3 = 0x10;
      uVar2 = 0;
      while( true ) {
        if (((*ppFVar1)->mValues).Count <= uVar2) break;
        (*(this->super_FListMenuItemSelectable).super_FListMenuItem._vptr_FListMenuItem[8])
                  (this,uVar2 & 0xffffffff,
                   *(undefined8 *)((long)&(((*ppFVar1)->mValues).Array)->Value + lVar3));
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x18;
      }
    }
  }
  return;
}

Assistant:

FValueTextItem::FValueTextItem(int x, int y, int height, const char *text, FFont *font, EColorRange color, EColorRange valuecolor, FName action, FName values)
: FListMenuItemSelectable(x, y, height, action)
{
	mText = text;
	mFont = font;
	mFontColor = color;
	mFontColor2 = valuecolor;
	mSelection = 0;
	if (values != NAME_None)
	{
		FOptionValues **opt = OptionValues.CheckKey(values);
		if (opt != NULL) 
		{
			for(unsigned i=0;i<(*opt)->mValues.Size(); i++)
			{
				SetString(i, (*opt)->mValues[i].Text);
			}
		}
	}
}